

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O0

void __thiscall
Atari2600::TIA::Player::enqueue_pixels(Player *this,int start,int end,int from_horizontal_counter)

{
  int from_horizontal_counter_local;
  int end_local;
  int start_local;
  Player *this_local;
  
  this->queue_[this->queue_write_pointer_].start = start;
  this->queue_[this->queue_write_pointer_].end = end;
  this->queue_[this->queue_write_pointer_].pixel_position = this->pixel_position;
  this->queue_[this->queue_write_pointer_].adder = this->adder;
  this->queue_[this->queue_write_pointer_].reverse_mask = this->reverse_mask;
  this->queue_write_pointer_ = this->queue_write_pointer_ + 1U & 3;
  skip_pixels(this,end - start,from_horizontal_counter);
  return;
}

Assistant:

void enqueue_pixels(const int start, const int end, int from_horizontal_counter) {
				queue_[queue_write_pointer_].start = start;
				queue_[queue_write_pointer_].end = end;
				queue_[queue_write_pointer_].pixel_position = pixel_position;
				queue_[queue_write_pointer_].adder = adder;
				queue_[queue_write_pointer_].reverse_mask = reverse_mask;
				queue_write_pointer_ = (queue_write_pointer_ + 1)&3;
				skip_pixels(end - start, from_horizontal_counter);
			}